

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.h
# Opt level: O1

size_t __thiscall wasm::DisjointSets::getUnion(DisjointSets *this,size_t elem1,size_t elem2)

{
  pointer pEVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  uVar2 = (long)(this->info).
                super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->info).
                super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if ((elem1 < uVar2) && (elem2 < uVar2)) {
    sVar3 = getRoot(this,elem1);
    sVar4 = getRoot(this,elem2);
    if (sVar3 != sVar4) {
      pEVar1 = (this->info).
               super__Vector_base<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = sVar4;
      if (pEVar1[sVar3].rank < pEVar1[sVar4].rank) {
        sVar5 = sVar3;
        sVar3 = sVar4;
      }
      pEVar1[sVar5].parent = sVar3;
      if (pEVar1[sVar3].rank == pEVar1[sVar5].rank) {
        pEVar1[sVar3].rank = pEVar1[sVar3].rank + 1;
      }
    }
    return sVar3;
  }
  __assert_fail("elem1 < info.size() && elem2 < info.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/disjoint_sets.h"
                ,0x40,"size_t wasm::DisjointSets::getUnion(size_t, size_t)");
}

Assistant:

size_t getUnion(size_t elem1, size_t elem2) {
    assert(elem1 < info.size() && elem2 < info.size());
    size_t root1 = getRoot(elem1);
    size_t root2 = getRoot(elem2);
    if (root1 == root2) {
      // Already in the same set.
      return root1;
    }
    // Canonicalize so that root1 has the greater rank.
    if (info[root1].rank < info[root2].rank) {
      std::swap(root1, root2);
    }
    // Merge the trees, smaller into larger.
    info[root2].parent = root1;
    // If the ranks were equal, the new root has a larger rank.
    if (info[root1].rank == info[root2].rank) {
      ++info[root1].rank;
    }
    return root1;
  }